

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O2

void __thiscall duckdb::DataTable::CommitDropTable(DataTable *this)

{
  pointer puVar1;
  RowGroupCollection *this_00;
  DataTableInfo *pDVar2;
  type pIVar3;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *index;
  pointer this_01;
  
  this_00 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this->row_groups);
  RowGroupCollection::CommitDropTable(this_00);
  pDVar2 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this->info);
  ::std::mutex::lock(&(pDVar2->indexes).indexes_lock);
  puVar1 = (pDVar2->indexes).indexes.
           super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (pDVar2->indexes).indexes.
                 super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_01 != puVar1; this_01 = this_01 + 1
      ) {
    pIVar3 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*(this_01)
    ;
    (*pIVar3->_vptr_Index[6])(pIVar3);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&pDVar2->indexes);
  return;
}

Assistant:

void DataTable::CommitDropTable() {
	// commit a drop of this table: mark all blocks as modified, so they can be reclaimed later on
	row_groups->CommitDropTable();

	// propagate dropping this table to its indexes: frees all index memory
	info->indexes.Scan([&](Index &index) {
		D_ASSERT(index.IsBound());
		index.Cast<BoundIndex>().CommitDrop();
		return false;
	});
}